

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O0

TestStatus *
vkt::wsi::anon_unknown_0::destroyNullHandleSurfaceTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  VkInstance instance;
  VkInstance_s **ppVVar1;
  VkAllocationCallbacks *pVVar2;
  size_t sVar3;
  allocator<char> local_2a9;
  string local_2a8;
  uint local_288;
  allocator<char> local_281;
  string local_280;
  VkSurfaceKHR local_260;
  undefined1 local_258 [8];
  AllocationCallbackRecorder recordingAllocator;
  VkSurfaceKHR local_1e0;
  VkSurfaceKHR nullHandle;
  InstanceHelper instHelper;
  Type wsiType_local;
  Context *context_local;
  
  instHelper.vki.m_vk.getPhysicalDeviceGeneratedCommandsPropertiesNVX._4_4_ = wsiType;
  InstanceHelper::InstanceHelper
            ((InstanceHelper *)&nullHandle,context,wsiType,(VkAllocationCallbacks *)0x0);
  ::vk::Handle<(vk::HandleType)25>::Handle(&local_1e0,0);
  ppVVar1 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)
                       &instHelper.supportedExtensions.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  recordingAllocator.m_records.m_last = (Block *)local_1e0.m_internal;
  ::vk::InstanceDriver::destroySurfaceKHR
            ((InstanceDriver *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             *ppVVar1,local_1e0,(VkAllocationCallbacks *)0x0);
  pVVar2 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_258,pVVar2,1);
  ppVVar1 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                      ((RefBase<vk::VkInstance_s_*> *)
                       &instHelper.supportedExtensions.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  instance = *ppVVar1;
  local_260.m_internal = local_1e0.m_internal;
  pVVar2 = ::vk::AllocationCallbacks::getCallbacks((AllocationCallbacks *)local_258);
  ::vk::InstanceDriver::destroySurfaceKHR
            ((InstanceDriver *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             instance,local_260,pVVar2);
  sVar3 = ::vk::AllocationCallbackRecorder::getNumRecords((AllocationCallbackRecorder *)local_258);
  if (sVar3 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"Implementation allocated/freed the memory",&local_281);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
  }
  local_288 = (uint)(sVar3 != 0);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_258);
  if (local_288 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"Destroying a VK_NULL_HANDLE surface has no effect",&local_2a9);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
    local_288 = 1;
  }
  InstanceHelper::~InstanceHelper((InstanceHelper *)&nullHandle);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus destroyNullHandleSurfaceTest (Context& context, Type wsiType)
{
	const InstanceHelper	instHelper	(context, wsiType);
	const VkSurfaceKHR		nullHandle	= DE_NULL;

	// Default allocator
	instHelper.vki.destroySurfaceKHR(*instHelper.instance, nullHandle, DE_NULL);

	// Custom allocator
	{
		AllocationCallbackRecorder	recordingAllocator	(getSystemAllocator(), 1u);

		instHelper.vki.destroySurfaceKHR(*instHelper.instance, nullHandle, recordingAllocator.getCallbacks());

		if (recordingAllocator.getNumRecords() != 0u)
			return tcu::TestStatus::fail("Implementation allocated/freed the memory");
	}

	return tcu::TestStatus::pass("Destroying a VK_NULL_HANDLE surface has no effect");
}